

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O3

int Inta_ManProcessRoots(Inta_Man_t *p)

{
  uint uVar1;
  Sto_Man_t *pSVar2;
  Sto_Cls_t **ppSVar3;
  uint uVar4;
  Sto_Cls_t *pSVar5;
  int iVar6;
  uint uVar7;
  Sto_Cls_t *pSVar8;
  
  pSVar2 = p->pCnf;
  pSVar5 = pSVar2->pHead;
  if (pSVar5 == (Sto_Cls_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    pSVar8 = pSVar5;
    do {
      if (((pSVar2->nClausesA <= iVar6 ^ (byte)*(uint *)&pSVar8->field_0x1c) & 1) == 0) {
        __assert_fail("(int)pClause->fA == (Counter < (int)p->pCnf->nClausesA)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                      ,0x341,"int Inta_ManProcessRoots(Inta_Man_t *)");
      }
      if (((*(uint *)&pSVar8->field_0x1c & 2) == 0) == iVar6 < pSVar2->nRoots) {
        __assert_fail("(int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                      ,0x342,"int Inta_ManProcessRoots(Inta_Man_t *)");
      }
      iVar6 = iVar6 + 1;
      pSVar8 = pSVar8->pNext;
    } while (pSVar8 != (Sto_Cls_t *)0x0);
  }
  if (pSVar2->nClauses != iVar6) {
    __assert_fail("p->pCnf->nClauses == Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x345,"int Inta_ManProcessRoots(Inta_Man_t *)");
  }
  if ((*(uint *)&pSVar2->pTail->field_0x1c & 0x7fffff8) != 0) {
    __assert_fail("p->pCnf->pTail->nLits == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x348,"int Inta_ManProcessRoots(Inta_Man_t *)");
  }
  p->nTrailSize = 0;
  for (; (pSVar5 != (Sto_Cls_t *)0x0 && (uVar4 = *(uint *)&pSVar5->field_0x1c, (uVar4 & 2) != 0));
      pSVar5 = pSVar5->pNext) {
    if ((uVar4 & 0x7fffff0) != 0) {
      uVar4 = *(uint *)&pSVar5[1].pNext;
      if (((int)uVar4 < 0) || (p->pCnf->nVars <= (int)(uVar4 >> 1))) {
LAB_008e0c02:
        __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                      ,0x15a,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
      }
      ppSVar3 = p->pWatches;
      pSVar5->pNext0 = ppSVar3[(ulong)uVar4 ^ 1];
      ppSVar3[(ulong)uVar4 ^ 1] = pSVar5;
      uVar7 = *(uint *)((long)&pSVar5[1].pNext + 4);
      if (((int)uVar7 < 0) || (p->pCnf->nVars <= (int)(uVar7 >> 1))) goto LAB_008e0c02;
      ppSVar3 = p->pWatches;
      (&pSVar5->pNext0)[uVar4 != uVar7] = ppSVar3[(ulong)uVar7 ^ 1];
      ppSVar3[(ulong)uVar7 ^ 1] = pSVar5;
      uVar4 = *(uint *)&pSVar5->field_0x1c;
    }
    if ((uVar4 & 0x7fffff8) == 8) {
      uVar4 = *(uint *)&pSVar5[1].pNext;
      if ((int)uVar4 < 0) {
LAB_008e0c21:
        __assert_fail("lit_check(pClause->pLits[0], p->pCnf->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                      ,0x358,"int Inta_ManProcessRoots(Inta_Man_t *)");
      }
      uVar7 = uVar4 >> 1;
      if (p->pCnf->nVars <= (int)uVar7) goto LAB_008e0c21;
      uVar1 = p->pAssigns[uVar7];
      if (uVar1 == 0xffffffff) {
        p->pAssigns[uVar7] = uVar4;
        p->pReasons[uVar7] = pSVar5;
        iVar6 = p->nTrailSize;
        p->nTrailSize = iVar6 + 1;
        p->pTrail[iVar6] = uVar4;
      }
      else if (uVar1 != uVar4) {
        Inta_ManProofTraceOne(p,pSVar5,p->pCnf->pEmpty);
        goto LAB_008e0b8c;
      }
    }
  }
  pSVar5 = Inta_ManPropagate(p,0);
  if (pSVar5 == (Sto_Cls_t *)0x0) {
    p->nRootSize = p->nTrailSize;
    iVar6 = 1;
  }
  else {
    Inta_ManProofTraceOne(p,pSVar5,p->pCnf->pEmpty);
LAB_008e0b8c:
    iVar6 = 0;
    if (p->fVerbose != 0) {
      puts("Found root level conflict!");
    }
  }
  return iVar6;
}

Assistant:

int Inta_ManProcessRoots( Inta_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Counter;

    // make sure the root clauses are preceeding the learnt clauses
    Counter = 0;
    Sto_ManForEachClause( p->pCnf, pClause )
    {
        assert( (int)pClause->fA    == (Counter < (int)p->pCnf->nClausesA) );
        assert( (int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)    );
        Counter++;
    }
    assert( p->pCnf->nClauses == Counter );

    // make sure the last clause if empty
    assert( p->pCnf->pTail->nLits == 0 );

    // go through the root unit clauses
    p->nTrailSize = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        // create watcher lists for the root clauses
        if ( pClause->nLits > 1 )
        {
            Inta_ManWatchClause( p, pClause, pClause->pLits[0] );
            Inta_ManWatchClause( p, pClause, pClause->pLits[1] );
        }
        // empty clause and large clauses
        if ( pClause->nLits != 1 )
            continue;
        // unit clause
        assert( lit_check(pClause->pLits[0], p->pCnf->nVars) );
        if ( !Inta_ManEnqueue( p, pClause->pLits[0], pClause ) )
        {
            // detected root level conflict
//            printf( "Error in Inta_ManProcessRoots(): Detected a root-level conflict too early!\n" );
//            assert( 0 );
            // detected root level conflict
            Inta_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
            if ( p->fVerbose )
                printf( "Found root level conflict!\n" );
            return 0;
        }
    }

    // propagate the root unit clauses
    pClause = Inta_ManPropagate( p, 0 );
    if ( pClause )
    {
        // detected root level conflict
        Inta_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
        if ( p->fVerbose )
            printf( "Found root level conflict!\n" );
        return 0;
    }

    // set the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}